

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  Schema SVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  Schema testListsSchema;
  Schema struct16Schema;
  char *pcStack_190;
  ArrayDisposer *pAStack_188;
  DebugComparison<kj::String,_kj::String> _kjCondition;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  SchemaType<capnproto_test::capnp::test::TestLists> nativeSchema;
  Reader local_f8;
  String local_c8;
  Schema structPSchema;
  Schema struct8Schema;
  Schema struct32Schema;
  uint local_8c;
  SchemaLoader loader;
  Reader local_60;
  
  SchemaLoader::SchemaLoader(&loader);
  local_f8._reader.segment = (SegmentReader *)(schemas::s_ad7beedc4ed30742 + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&local_f8);
  struct32Schema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  nativeSchema.super_Schema.raw = (Schema)((long)schemas::s_e41885c94393277e + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&nativeSchema.super_Schema);
  testListsSchema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  local_f8._reader.segment = (SegmentReader *)(schemas::s_a6411a353090145b + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&local_f8);
  struct8Schema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  local_f8._reader.segment = (SegmentReader *)(schemas::s_c6abf1b0329e6227 + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&local_f8);
  structPSchema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  Schema::getProto(&local_f8,&nativeSchema.super_Schema);
  kj::str<capnp::schema::Node::Reader>((String *)&struct16Schema,&local_f8);
  _kjCondition_8._0_8_ = struct16Schema.raw;
  _kjCondition_8.op.content.ptr = pcStack_190;
  _kjCondition_8.op.content.size_ = (size_t)pAStack_188;
  struct16Schema.raw = (RawBrandedSchema *)0x0;
  Schema::getProto(&local_60,&testListsSchema);
  kj::str<capnp::schema::Node::Reader>(&local_c8,&local_60);
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&_kjCondition_8,&local_c8);
  sVar3 = local_c8.content.size_;
  pcVar2 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  pcVar2 = _kjCondition_8.op.content.ptr;
  uVar4 = _kjCondition_8._0_8_;
  if (_kjCondition_8._0_8_ != 0) {
    _kjCondition_8.left = 0;
    _kjCondition_8.right = 0;
    _kjCondition_8.op.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)_kjCondition_8.op.content.size_)
              (_kjCondition_8.op.content.size_,uVar4,1,pcVar2,pcVar2,0);
  }
  SVar1.raw = struct16Schema.raw;
  if (struct16Schema.raw != (RawBrandedSchema *)0x0) {
    struct16Schema.raw = (RawBrandedSchema *)0x0;
    (**pAStack_188->_vptr_ArrayDisposer)(pAStack_188,SVar1.raw,1,0,0,0);
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto(&local_f8,&nativeSchema.super_Schema);
    kj::str<capnp::schema::Node::Reader>((String *)&_kjCondition_8,&local_f8);
    Schema::getProto(&local_60,&testListsSchema);
    kj::str<capnp::schema::Node::Reader>((String *)&struct16Schema,&local_60);
    kj::_::Debug::
    log<char_const(&)[93],kj::_::DebugComparison<kj::String,kj::String>&,kj::String,kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x2d,ERROR,
               "\"failed: expected \" \"(kj::str(nativeSchema.getProto())) == (kj::str(testListsSchema.getProto()))\", _kjCondition, kj::str(nativeSchema.getProto()), kj::str(testListsSchema.getProto())"
               ,(char (*) [93])
                "failed: expected (kj::str(nativeSchema.getProto())) == (kj::str(testListsSchema.getProto()))"
               ,&_kjCondition,(String *)&_kjCondition_8,(String *)&struct16Schema);
    SVar1 = struct16Schema;
    if (struct16Schema.raw != (RawBrandedSchema *)0x0) {
      struct16Schema.raw = (RawBrandedSchema *)0x0;
      (**pAStack_188->_vptr_ArrayDisposer)(pAStack_188,SVar1.raw,1,0,0,0);
    }
    pcVar2 = _kjCondition_8.op.content.ptr;
    uVar4 = _kjCondition_8._0_8_;
    if (_kjCondition_8._0_8_ != 0) {
      _kjCondition_8.left = 0;
      _kjCondition_8.right = 0;
      _kjCondition_8.op.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)_kjCondition_8.op.content.size_)
                (_kjCondition_8.op.content.size_,uVar4,1,pcVar2,pcVar2,0);
    }
  }
  sVar3 = _kjCondition.right.content.size_;
  pcVar2 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  sVar3 = _kjCondition.left.content.size_;
  pcVar2 = _kjCondition.left.content.ptr;
  if (_kjCondition.left.content.ptr != (char *)0x0) {
    _kjCondition.left.content.ptr = (char *)0x0;
    _kjCondition.left.content.size_ = 0;
    (**(_kjCondition.left.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.left.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        (Schema)testListsSchema.raw != nativeSchema.super_Schema.raw);
  if (((Schema)testListsSchema.raw == nativeSchema.super_Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x2f,ERROR,
               "\"failed: expected \" \"!(testListsSchema == nativeSchema)\", _kjCondition",
               (char (*) [52])"failed: expected !(testListsSchema == nativeSchema)",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        struct32Schema.raw !=
                        (RawBrandedSchema *)(schemas::s_ad7beedc4ed30742 + 0x48));
  if ((struct32Schema.raw == (RawBrandedSchema *)(schemas::s_ad7beedc4ed30742 + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"!(struct32Schema == Schema::from<test::TestLists::Struct32>())\", _kjCondition"
               ,(char (*) [80])
                "failed: expected !(struct32Schema == Schema::from<test::TestLists::Struct32>())",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        struct8Schema.raw !=
                        (RawBrandedSchema *)(schemas::s_a6411a353090145b + 0x48));
  if ((struct8Schema.raw == (RawBrandedSchema *)(schemas::s_a6411a353090145b + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"!(struct8Schema == Schema::from<test::TestLists::Struct8>())\", _kjCondition"
               ,(char (*) [78])
                "failed: expected !(struct8Schema == Schema::from<test::TestLists::Struct8>())",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        structPSchema.raw !=
                        (RawBrandedSchema *)(schemas::s_c6abf1b0329e6227 + 0x48));
  if ((structPSchema.raw == (RawBrandedSchema *)(schemas::s_c6abf1b0329e6227 + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x32,ERROR,
               "\"failed: expected \" \"!(structPSchema == Schema::from<test::TestLists::StructP>())\", _kjCondition"
               ,(char (*) [78])
                "failed: expected !(structPSchema == Schema::from<test::TestLists::StructP>())",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)Schema::getDependency(&testListsSchema,0xad7beedc4ed30742,0);
  _kjCondition.left.content.size_ = (size_t)&struct32Schema;
  _kjCondition.left.content.disposer = (ArrayDisposer *)anon_var_dwarf_3a16;
  _kjCondition.right.content.ptr = &DAT_00000005;
  _kjCondition.right.content.size_ =
       CONCAT71(_kjCondition.right.content.size_._1_7_,
                (RawBrandedSchema *)_kjCondition.left.content.ptr == struct32Schema.raw);
  if (((RawBrandedSchema *)_kjCondition.left.content.ptr != struct32Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[102],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x34,ERROR,
               "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema\", _kjCondition"
               ,(char (*) [102])
                "failed: expected testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema"
               ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)Schema::getDependency(&testListsSchema,0xa6411a353090145b,0);
  _kjCondition.left.content.size_ = (size_t)&struct8Schema;
  _kjCondition.left.content.disposer = (ArrayDisposer *)anon_var_dwarf_3a16;
  _kjCondition.right.content.ptr = &DAT_00000005;
  _kjCondition.right.content.size_ =
       CONCAT71(_kjCondition.right.content.size_._1_7_,
                (RawBrandedSchema *)_kjCondition.left.content.ptr == struct8Schema.raw);
  if (((RawBrandedSchema *)_kjCondition.left.content.ptr != struct8Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[100],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema\", _kjCondition"
               ,(char (*) [100])
                "failed: expected testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema"
               ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)Schema::getDependency(&testListsSchema,0xc6abf1b0329e6227,0);
  _kjCondition.left.content.size_ = (size_t)&structPSchema;
  _kjCondition.left.content.disposer = (ArrayDisposer *)anon_var_dwarf_3a16;
  _kjCondition.right.content.ptr = &DAT_00000005;
  _kjCondition.right.content.size_ =
       CONCAT71(_kjCondition.right.content.size_._1_7_,
                (RawBrandedSchema *)_kjCondition.left.content.ptr == structPSchema.raw);
  if (((RawBrandedSchema *)_kjCondition.left.content.ptr != structPSchema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[100],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema\", _kjCondition"
               ,(char (*) [100])
                "failed: expected testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema"
               ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)&_kjCondition);
  }
  struct16Schema = Schema::getDependency(&testListsSchema,0xa8abf7a82928986c,0);
  Schema::getProto(&local_f8,&struct16Schema);
  if (local_f8._reader.pointerCount < 4) {
    local_60._reader.pointers._0_4_ = 0x7fffffff;
    local_60._reader.capTable = (CapTableReader *)0x0;
    local_60._reader.data = (WirePointer *)0x0;
    local_60._reader.segment = (SegmentReader *)0x0;
  }
  else {
    local_60._reader.data = local_f8._reader.pointers + 3;
    local_60._reader.capTable = local_f8._reader.capTable;
    local_60._reader.segment = local_f8._reader.segment;
    local_60._reader.pointers._0_4_ = local_f8._reader.nestingLimit;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&local_60,INLINE_COMPOSITE,(word *)0x0);
  _kjCondition_8._0_8_ = (long)_kjCondition.right.content.ptr << 0x20;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  _kjCondition_8.result = (uint)_kjCondition.right.content.ptr == 0;
  if ((!_kjCondition_8.result) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.content.ptr = (char *)((ulong)local_c8.content.ptr & 0xffffffff00000000);
    Schema::getProto(&local_f8,&struct16Schema);
    if (local_f8._reader.pointerCount < 4) {
      local_f8._reader.nestingLimit = 0x7fffffff;
      local_f8._reader.capTable = (CapTableReader *)0x0;
      local_60._reader.data = (WirePointer *)0x0;
      local_60._reader.segment = (SegmentReader *)0x0;
    }
    else {
      local_60._reader.data = local_f8._reader.pointers + 3;
      local_60._reader.segment = local_f8._reader.segment;
    }
    local_60._reader.capTable = local_f8._reader.capTable;
    local_60._reader.pointers._0_4_ = local_f8._reader.nestingLimit;
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&local_60,INLINE_COMPOSITE,(word *)0x0);
    local_8c = (uint)_kjCondition.right.content.ptr;
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"(0u) == (struct16Schema.getProto().getStruct().getFields().size())\", _kjCondition, 0u, struct16Schema.getProto().getStruct().getFields().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (struct16Schema.getProto().getStruct().getFields().size())"
               ,&_kjCondition_8,(uint *)&local_c8,&local_8c);
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Load) {
  SchemaLoader loader;

  Schema struct32Schema = loader.load(Schema::from<test::TestLists::Struct32>().getProto());

  auto nativeSchema = Schema::from<test::TestLists>();
  Schema testListsSchema = loader.load(nativeSchema.getProto());

  Schema struct8Schema = loader.load(Schema::from<test::TestLists::Struct8>().getProto());
  Schema structPSchema = loader.load(Schema::from<test::TestLists::StructP>().getProto());

  EXPECT_EQ(kj::str(nativeSchema.getProto()), kj::str(testListsSchema.getProto()));

  EXPECT_FALSE(testListsSchema == nativeSchema);
  EXPECT_FALSE(struct32Schema == Schema::from<test::TestLists::Struct32>());
  EXPECT_FALSE(struct8Schema == Schema::from<test::TestLists::Struct8>());
  EXPECT_FALSE(structPSchema == Schema::from<test::TestLists::StructP>());

  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema);
  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema);
  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema);

  auto struct16Schema = testListsSchema.getDependency(typeId<test::TestLists::Struct16>());
  EXPECT_EQ(0u, struct16Schema.getProto().getStruct().getFields().size());
}